

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporterPtr __thiscall
Catch::anon_unknown_1::makeReporter(anon_unknown_1 *this,shared_ptr<Catch::Config> *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
  *pvVar4;
  ListeningReporter *pLVar5;
  undefined4 extraout_var_00;
  element_type *peVar6;
  element_type *peVar7;
  string *psVar8;
  shared_ptr<const_Catch::IConfig> local_b0;
  IStreamingReporterPtr local_a0;
  shared_ptr<const_Catch::IConfig> local_98;
  ReporterConfig local_88;
  IStreamingReporterPtr local_70;
  __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_68;
  shared_ptr<Catch::IReporterFactory> *listener;
  const_iterator __end2;
  const_iterator __begin2;
  Listeners *__range2;
  Listeners *listeners;
  ListeningReporter *multi;
  shared_ptr<const_Catch::IConfig> local_28;
  __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<Catch::Config> *config_local;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *ret;
  
  local_18 = (__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)config;
  config_local = (shared_ptr<Catch::Config> *)this;
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
  pvVar4 = (vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
            *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))();
  bVar1 = clara::std::
          vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
          ::empty(pvVar4);
  if (bVar1) {
    peVar7 = clara::std::
             __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    psVar8 = Config::getReporterName_abi_cxx11_(peVar7);
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              ((shared_ptr<Catch::IConfig_const> *)&local_28,(shared_ptr<Catch::Config> *)local_18);
    createReporter(this,psVar8,(IConfigPtr *)&local_28);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&local_28);
  }
  else {
    pLVar5 = (ListeningReporter *)operator_new(0x30);
    ListeningReporter::ListeningReporter(pLVar5);
    std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>::
    unique_ptr<std::default_delete<Catch::IStreamingReporter>,void>
              ((unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>
                *)this,(pointer)pLVar5);
    pLVar5 = (ListeningReporter *)
             clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator*((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                          *)this);
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
    pvVar4 = (vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
              *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))();
    __end2 = clara::std::
             vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
             ::begin(pvVar4);
    listener = (shared_ptr<Catch::IReporterFactory> *)
               clara::std::
               vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
               ::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
                                       *)&listener), bVar1) {
      local_68 = (__shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
                    ::operator*(&__end2);
      peVar6 = clara::std::
               __shared_ptr_access<Catch::IReporterFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_68);
      std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
                ((shared_ptr<Catch::IConfig_const> *)&local_98,(shared_ptr<Catch::Config> *)local_18
                );
      ReporterConfig::ReporterConfig(&local_88,(IConfigPtr *)&local_98);
      (*peVar6->_vptr_IReporterFactory[2])(&local_70,peVar6,&local_88);
      ListeningReporter::addListener(pLVar5,&local_70);
      clara::std::
      unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
      ~unique_ptr(&local_70);
      ReporterConfig::~ReporterConfig(&local_88);
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&local_98);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Catch::IReporterFactory>_*,_std::vector<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>_>
      ::operator++(&__end2);
    }
    peVar7 = clara::std::
             __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_18);
    psVar8 = Config::getReporterName_abi_cxx11_(peVar7);
    std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
              ((shared_ptr<Catch::IConfig_const> *)&local_b0,(shared_ptr<Catch::Config> *)local_18);
    createReporter((anon_unknown_1 *)&local_a0,psVar8,(IConfigPtr *)&local_b0);
    ListeningReporter::addReporter(pLVar5,&local_a0);
    clara::std::
    unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
    ~unique_ptr(&local_a0);
    clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr(&local_b0);
  }
  return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
            )this;
}

Assistant:

IStreamingReporterPtr makeReporter(std::shared_ptr<Config> const& config) {
            if (Catch::getRegistryHub().getReporterRegistry().getListeners().empty()) {
                return createReporter(config->getReporterName(), config);
            }

            // On older platforms, returning std::unique_ptr<ListeningReporter>
            // when the return type is std::unique_ptr<IStreamingReporter>
            // doesn't compile without a std::move call. However, this causes
            // a warning on newer platforms. Thus, we have to work around
            // it a bit and downcast the pointer manually.
            auto ret = std::unique_ptr<IStreamingReporter>(new ListeningReporter);
            auto& multi = static_cast<ListeningReporter&>(*ret);
            auto const& listeners = Catch::getRegistryHub().getReporterRegistry().getListeners();
            for (auto const& listener : listeners) {
                multi.addListener(listener->create(Catch::ReporterConfig(config)));
            }
            multi.addReporter(createReporter(config->getReporterName(), config));
            return ret;
        }